

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall
cppcms::application::add
          (application *this,application *app,string *name,string *url,string *regex,int part)

{
  application *paVar1;
  application *paVar2;
  undefined4 in_register_0000008c;
  
  if (app->parent_ != this) {
    app->parent_ = this;
    paVar2 = this->root_;
    paVar1 = paVar2->root_;
    if (paVar2 != paVar2->root_) {
      do {
        paVar2 = paVar1;
        this->root_ = paVar2;
        paVar1 = paVar2->root_;
      } while (paVar2->root_ != paVar2);
    }
    app->root_ = paVar2;
  }
  url_dispatcher::mount
            ((((this->d).ptr_)->url_disp).ptr_,(char *)regex,(char *)app,(char *)(ulong)(uint)part,
             (ulong)regex,(void *)CONCAT44(in_register_0000008c,part));
  url_mapper::mount((((this->d).ptr_)->url_map).ptr_,(char *)name,(char *)url,(char *)app,
                    (ulong)regex,(void *)CONCAT44(in_register_0000008c,part));
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url,std::string const &regex,int part)
{
	add(app);
	dispatcher().mount(regex,app,part);
	mapper().mount(name,url,app);
}